

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# em_full_vars.c
# Opt level: O1

float Expectation(float *Tau,float *x,float *c,float **mean,float **hafinvvar,float *corprod,int K,
                 int Ndim)

{
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  double dVar4;
  float fVar5;
  
  uVar1 = (ulong)(uint)K;
  fVar3 = gauss(x,*mean,*hafinvvar,*corprod,Ndim);
  *Tau = fVar3;
  if (1 < K) {
    uVar2 = 1;
    fVar5 = fVar3;
    do {
      fVar3 = gauss(x,mean[uVar2],hafinvvar[uVar2],corprod[uVar2],Ndim);
      Tau[uVar2] = fVar3;
      if (fVar3 <= fVar5) {
        fVar3 = fVar5;
      }
      uVar2 = uVar2 + 1;
      fVar5 = fVar3;
    } while (uVar1 != uVar2);
  }
  if (K < 1) {
    fVar5 = 0.0;
  }
  else {
    fVar5 = 0.0;
    uVar2 = 0;
    do {
      if (Tau[uVar2] <= fVar3 + -22.0) {
        Tau[uVar2] = 0.0;
      }
      else {
        dVar4 = exp((double)((Tau[uVar2] - fVar3) + 10.0));
        Tau[uVar2] = (float)dVar4;
        fVar5 = fVar5 + (float)dVar4;
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  if (0 < K) {
    uVar2 = 0;
    do {
      Tau[uVar2] = Tau[uVar2] * (1.0 / fVar5);
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  dVar4 = log((double)fVar5);
  return (float)(dVar4 + (double)fVar3 + -10.0);
}

Assistant:

float Expectation(float *Tau,	/* Mode probablity of observation vector x */
		  float *x,	/* Observation vector x */
		  float *c,	/* Mixing proportions of modes */
		  float **mean,	/* Means of the modes */
		  float **hafinvvar,	/* 1.0/(2.0*variance) of the modes */
		  float *corprod,	/* Precomputed 1/sqrt(2PI**Ndim * mod(variance)) */
		  int K,	/* Number of modes */
		  int Ndim	/* Dimensionality of observation/distribution */
    )
{
	float Probability, max, sum, invsum;

	int i;


	Tau[0] = max = gauss(x, mean[0], hafinvvar[0], corprod[0], Ndim);
	for (i = 1; i < K; ++i) {
		/*
		 * Note: prior c[i] has already been factored into corprod
		 */
		Tau[i] = gauss(x, mean[i], hafinvvar[i], corprod[i], Ndim);
		if (Tau[i] > max)
			max = Tau[i];
	}

	/* convert Tau from log to linear */
	sum = 0.0;
	for (i = 0; i < K; ++i) {
		if (Tau[i] > max - 22) {	/* only consider probs within 10^10 of max */
			Tau[i] = exp(Tau[i] - max + 10);
			sum += Tau[i];
		} else
			Tau[i] = 0;
	}
	invsum = 1.0 / sum;
	for (i = 0; i < K; ++i)
		Tau[i] *= invsum;

	Probability = max + log(sum) - 10;
	return (Probability);
}